

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O0

UChar * uregex_getText_63(URegularExpression *regexp2,int32_t *textLength,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *dest;
  UChar *inputChars;
  int64_t iStack_40;
  UErrorCode lengthStatus;
  int64_t inputNativeLength;
  UText *inputText;
  RegularExpression *regexp;
  UErrorCode *status_local;
  int32_t *textLength_local;
  URegularExpression *regexp2_local;
  
  inputText = (UText *)regexp2;
  regexp = (RegularExpression *)status;
  status_local = textLength;
  textLength_local = (int32_t *)regexp2;
  UVar1 = validateRE((RegularExpression *)regexp2,'\0',status);
  if (UVar1 == '\0') {
    regexp2_local = (URegularExpression *)0x0;
  }
  else {
    if (inputText->chunkContents == (UChar *)0x0) {
      inputNativeLength =
           (int64_t)icu_63::RegexMatcher::inputText(*(RegexMatcher **)&inputText->chunkOffset);
      iStack_40 = utext_nativeLength_63((UText *)inputNativeLength);
      if (((*(long *)(inputNativeLength + 0x20) == 0) &&
          (iStack_40 == *(long *)(inputNativeLength + 0x10))) &&
         (iStack_40 == *(int *)(inputNativeLength + 0x1c))) {
        inputText->chunkContents = *(UChar **)(inputNativeLength + 0x30);
        *(int *)&inputText->pFuncs = (int)iStack_40;
        *(undefined1 *)((long)&inputText->pFuncs + 4) = 0;
      }
      else {
        inputChars._4_4_ = 0;
        iVar2 = utext_extract_63((UText *)inputNativeLength,0,iStack_40,(UChar *)0x0,0,
                                 (UErrorCode *)((long)&inputChars + 4));
        *(int32_t *)&inputText->pFuncs = iVar2;
        dest = (UChar *)uprv_malloc_63((long)(*(int *)&inputText->pFuncs + 1) << 1);
        utext_extract_63((UText *)inputNativeLength,0,iStack_40,dest,*(int *)&inputText->pFuncs + 1,
                         &regexp->fMagic);
        inputText->chunkContents = dest;
        *(undefined1 *)((long)&inputText->pFuncs + 4) = 1;
      }
    }
    if (status_local != (UErrorCode *)0x0) {
      *status_local = *(UErrorCode *)&inputText->pFuncs;
    }
    regexp2_local = (URegularExpression *)inputText->chunkContents;
  }
  return (UChar *)regexp2_local;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
uregex_getText(URegularExpression *regexp2,
               int32_t            *textLength,
               UErrorCode         *status)  {
    RegularExpression *regexp = (RegularExpression*)regexp2;
    if (validateRE(regexp, FALSE, status) == FALSE) {
        return NULL;
    }

    if (regexp->fText == NULL) {
        // need to fill in the text
        UText *inputText = regexp->fMatcher->inputText();
        int64_t inputNativeLength = utext_nativeLength(inputText);
        if (UTEXT_FULL_TEXT_IN_CHUNK(inputText, inputNativeLength)) {
            regexp->fText = inputText->chunkContents;
            regexp->fTextLength = (int32_t)inputNativeLength;
            regexp->fOwnsText = FALSE; // because the UText owns it
        } else {
            UErrorCode lengthStatus = U_ZERO_ERROR;
            regexp->fTextLength = utext_extract(inputText, 0, inputNativeLength, NULL, 0, &lengthStatus); // buffer overflow error
            UChar *inputChars = (UChar *)uprv_malloc(sizeof(UChar)*(regexp->fTextLength+1));

            utext_extract(inputText, 0, inputNativeLength, inputChars, regexp->fTextLength+1, status);
            regexp->fText = inputChars;
            regexp->fOwnsText = TRUE; // should already be set but just in case
        }
    }

    if (textLength != NULL) {
        *textLength = regexp->fTextLength;
    }
    return regexp->fText;
}